

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.h
# Opt level: O2

int DisconnectgpControl(GPCONTROL *pgpControl)

{
  int iVar1;
  
  if ((pgpControl->bDisableHTTPPersistent == 0) &&
     (iVar1 = releasetcpcli(pgpControl->tcpsock), iVar1 != 0)) {
    puts("Error while disconnecting a gpControl.");
    CloseRS232Port(&pgpControl->RS232Port);
  }
  else {
    iVar1 = CloseRS232Port(&pgpControl->RS232Port);
    if (iVar1 == 0) {
      puts("gpControl disconnected.");
      return 0;
    }
    puts("gpControl disconnection failed.");
  }
  return 1;
}

Assistant:

inline int DisconnectgpControl(GPCONTROL* pgpControl)
{
	if (!pgpControl->bDisableHTTPPersistent)
	{
		if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
		{
			printf("Error while disconnecting a gpControl.\n");
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
	}

	if (CloseRS232Port(&pgpControl->RS232Port) != EXIT_SUCCESS)
	{
		printf("gpControl disconnection failed.\n");
		return EXIT_FAILURE;
	}

	printf("gpControl disconnected.\n");

	return EXIT_SUCCESS;
}